

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleStringBuffer_writePastLimit_Test::testBody
          (TEST_SimpleStringBuffer_writePastLimit_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  int iVar5;
  SimpleString str;
  SimpleStringBuffer buffer;
  SimpleString local_1040;
  SimpleStringBuffer local_1030;
  
  SimpleStringBuffer::SimpleStringBuffer(&local_1030);
  iVar5 = 0x2000;
  do {
    SimpleStringBuffer::add(&local_1030,"h");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  SimpleString::SimpleString(&local_1040,"h",0xfff);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString(&local_1040);
  pcVar3 = SimpleStringBuffer::toString(&local_1030);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,pcVar2,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x24c,pTVar4);
  SimpleString::~SimpleString(&local_1040);
  return;
}

Assistant:

TEST(SimpleStringBuffer, writePastLimit)
{
    SimpleStringBuffer buffer;
    for (int i = 0; i < SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN * 2; i++)
        buffer.add("h");
    SimpleString str("h", SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN-1);
    STRCMP_EQUAL(str.asCharString(), buffer.toString());
}